

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

void __thiscall higan::EventLoopThread::EventLoopThread(EventLoopThread *this,string *name)

{
  EventLoop *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  ThreadFunc local_48;
  string *local_18;
  string *name_local;
  EventLoopThread *this_local;
  
  local_18 = name;
  name_local = &this->name_;
  std::__cxx11::string::string((string *)this,(string *)name);
  EventLoop::EventLoop(&this->loop_);
  local_70 = EventLoop::Loop;
  local_68 = 0;
  local_78 = &this->loop_;
  std::bind<void(higan::EventLoop::*)(),higan::EventLoop*>
            (&local_60,(offset_in_EventLoop_to_subr *)&local_70,&local_78);
  std::function<void()>::function<std::_Bind<void(higan::EventLoop::*(higan::EventLoop*))()>,void>
            ((function<void()> *)&local_48,&local_60);
  Thread::Thread(&this->thread_,&this->name_,&local_48);
  std::function<void_()>::~function(&local_48);
  Thread::Start(&this->thread_);
  return;
}

Assistant:

EventLoopThread::EventLoopThread(const std::string& name):
		name_(name),
		loop_(),
		thread_(name_, std::bind(&EventLoop::Loop, &loop_))
{
	thread_.Start();
}